

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence.hpp
# Opt level: O2

void __thiscall biosoup::Sequence::ReverseAndComplement(Sequence *this)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  
  pcVar1 = (this->data)._M_dataplus._M_p;
  sVar2 = (this->data)._M_string_length;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    iVar3 = toupper((uint)(byte)pcVar1[sVar5]);
    uVar4 = (int)(char)iVar3 - 0x41;
    if ((uVar4 < 0x19) && ((0x13a14cfU >> (uVar4 & 0x1f) & 1) != 0)) {
      pcVar1[sVar5] = (&DAT_00117070)[uVar4];
    }
  }
  pcVar1 = (this->data)._M_dataplus._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar1,pcVar1 + (this->data)._M_string_length);
  pcVar1 = (this->quality)._M_dataplus._M_p;
  std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pcVar1,pcVar1 + (this->quality)._M_string_length);
  return;
}

Assistant:

void ReverseAndComplement() {  // (optional) Watson-Crick base pairing
    for (auto& it : data) {
      switch (static_cast<char>(std::toupper(static_cast<unsigned char>(it)))) {
        case 'A': it = 'T'; break;
        case 'C': it = 'G'; break;
        case 'G': it = 'C'; break;
        case 'T': case 'U': it = 'A'; break;
        case 'R': it = 'Y'; break;  // A || G
        case 'Y': it = 'R'; break;  // C || T (U)
        case 'K': it = 'M'; break;  // G || T (U)
        case 'M': it = 'K'; break;  // A || C
        case 'S': break;  // C || G
        case 'W': break;  // A || T (U)
        case 'B': it = 'V'; break;  // !A
        case 'D': it = 'H'; break;  // !C
        case 'H': it = 'D'; break;  // !G
        case 'V': it = 'B'; break;  // !T (!U)
        default: break;  // N || -
      }
    }
    std::reverse(data.begin(), data.end());
    std::reverse(quality.begin(), quality.end());
  }